

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

FeatureType __thiscall
CoreML::FeatureType::Array
          (FeatureType *this,vector<long,_std::allocator<long>_> *shape,MLArrayDataType dataType)

{
  int iVar1;
  FeatureType *this_00;
  long *plVar2;
  long lVar3;
  ArrayFeatureType *pAVar4;
  uint uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long *plVar7;
  FeatureType FVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  FeatureType(this,MLFeatureTypeType_multiArrayType);
  this_00 = (this->m_type).
            super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  _Var6._M_pi = extraout_RDX;
  if (this_00->_oneof_case_[0] != 5) {
    Specification::FeatureType::clear_Type(this_00);
    this_00->_oneof_case_[0] = 5;
    pAVar4 = (ArrayFeatureType *)operator_new(0x48);
    Specification::ArrayFeatureType::ArrayFeatureType(pAVar4);
    (this_00->Type_).multiarraytype_ = pAVar4;
    _Var6._M_pi = extraout_RDX_00;
  }
  pAVar4 = (this_00->Type_).multiarraytype_;
  plVar7 = (shape->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  plVar2 = (shape->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (plVar7 != plVar2) {
    do {
      lVar3 = *plVar7;
      iVar1 = (pAVar4->shape_).total_size_;
      if ((pAVar4->shape_).current_size_ == iVar1) {
        google::protobuf::RepeatedField<long>::Reserve(&pAVar4->shape_,iVar1 + 1);
      }
      iVar1 = (pAVar4->shape_).current_size_;
      uVar5 = iVar1 + 1;
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar5;
      (pAVar4->shape_).current_size_ = uVar5;
      ((pAVar4->shape_).rep_)->elements[iVar1] = lVar3;
      plVar7 = plVar7 + 1;
    } while (plVar7 != plVar2);
  }
  pAVar4->datatype_ = dataType;
  FVar8.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  FVar8.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (FeatureType)
         FVar8.m_type.
         super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FeatureType FeatureType::Array(const std::vector<int64_t> shape, MLArrayDataType dataType) {
        FeatureType out(MLFeatureTypeType_multiArrayType);
        Specification::ArrayFeatureType *params = out->mutable_multiarraytype();
        
        for (int64_t s : shape) {
            params->add_shape(s);
        }
        params->set_datatype(static_cast<Specification::ArrayFeatureType::ArrayDataType>(dataType));
        return out;
    }